

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsKeyPressed(int user_key_index,bool repeat)

{
  float fVar1;
  float repeat_delay;
  int iVar2;
  
  if (-1 < user_key_index) {
    if (0x1ff < (uint)user_key_index) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1202,"bool ImGui::IsKeyPressed(int, bool)");
    }
    fVar1 = (GImGui->IO).KeysDownDuration[(uint)user_key_index];
    if (!repeat || fVar1 == 0.0) {
      return fVar1 == 0.0;
    }
    repeat_delay = (GImGui->IO).KeyRepeatDelay;
    if (repeat_delay < fVar1) {
      iVar2 = GetKeyPressedAmount(user_key_index,repeat_delay,(GImGui->IO).KeyRepeatRate);
      return 0 < iVar2;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyPressed(int user_key_index, bool repeat)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0)
        return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[user_key_index];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(user_key_index, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}